

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O1

callback_t *
multi_purpose_string_state
          (callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  QTextStream *pQVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  QDebug *pQVar5;
  code *pcVar6;
  string *s;
  bool bVar7;
  initializer_list<char> __l;
  initializer_list<char> __l_00;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  vector<char,_std::allocator<char>_> delimiters;
  QDebug local_90;
  undefined7 uStack_8f;
  QString local_88;
  allocator_type local_69;
  string local_68;
  vector<char,_std::allocator<char>_> local_48;
  
  local_68._M_dataplus._M_p._0_4_ = 0x203d5b7b;
  local_68._M_dataplus._M_p._4_4_ = CONCAT31(local_68._M_dataplus._M_p._5_3_,10);
  __l._M_len = 5;
  __l._M_array = (iterator)&local_68;
  std::vector<char,_std::allocator<char>_>::vector(&local_48,__l,(allocator_type *)&local_88);
  read_untill_delimiters_abi_cxx11_(&local_68,f,&local_48);
  std::__cxx11::string::_M_append
            ((char *)&(anonymous_namespace)::global_string_abi_cxx11_,
             CONCAT44(local_68._M_dataplus._M_p._4_4_,local_68._M_dataplus._M_p._0_4_));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_68._M_dataplus._M_p._4_4_,local_68._M_dataplus._M_p._0_4_) !=
      &local_68.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_68._M_dataplus._M_p._4_4_,local_68._M_dataplus._M_p._0_4_),
                    CONCAT44(local_68.field_2._M_allocated_capacity._4_4_,
                             local_68.field_2._M_allocated_capacity._0_4_) + 1);
  }
  anon_unknown.dwarf_22738::trim((string *)&(anonymous_namespace)::global_string_abi_cxx11_);
  parser();
  if ((parser()::category[0x10] & 1) != 0) {
    parser();
    local_68._M_dataplus._M_p._0_4_ = 2;
    local_68._M_dataplus._M_p._4_4_ = 0;
    local_68._M_string_length._0_4_ = 0;
    local_68._M_string_length._4_4_ = 0;
    local_68.field_2._M_allocated_capacity._0_4_ = 0;
    local_68.field_2._M_allocated_capacity._4_4_ = 0;
    local_68.field_2._8_8_ = parser()::category._8_8_;
    QMessageLogger::debug();
    pQVar1 = (QTextStream *)CONCAT71(uStack_8f,local_90);
    QVar8.m_data = (storage_type *)0xe;
    QVar8.m_size = (qsizetype)&local_88;
    QString::fromUtf8(QVar8);
    QTextStream::operator<<(pQVar1,&local_88);
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
      }
    }
    if (((QTextStream *)CONCAT71(uStack_8f,local_90))[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)CONCAT71(uStack_8f,local_90),' ');
    }
    pQVar5 = operator<<(&local_90,(string *)&(anonymous_namespace)::global_string_abi_cxx11_);
    pQVar1 = *(QTextStream **)pQVar5;
    QVar9.m_data = (storage_type *)0x11;
    QVar9.m_size = (qsizetype)&local_88;
    QString::fromUtf8(QVar9);
    QTextStream::operator<<(pQVar1,&local_88);
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
      }
    }
    if ((*(QTextStream **)pQVar5)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)pQVar5,' ');
    }
    cVar3 = std::istream::peek();
    QTextStream::operator<<(*(QTextStream **)pQVar5,cVar3);
    if ((*(QTextStream **)pQVar5)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)pQVar5,' ');
    }
    QDebug::~QDebug(&local_90);
  }
  if ((conf->top_level_class).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    iVar4 = std::__cxx11::string::compare((char *)&(anonymous_namespace)::global_string_abi_cxx11_);
    if (iVar4 != 0) goto LAB_00105b07;
    local_90 = (QDebug)0x7b;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_90;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_88,__l_00,&local_69);
    read_untill_delimiters_abi_cxx11_(&local_68,f,(vector<char,_std::allocator<char>_> *)&local_88);
    s = &conf->conf_namespace;
    std::__cxx11::string::operator=((string *)s,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_68._M_dataplus._M_p._4_4_,local_68._M_dataplus._M_p._0_4_) !=
        &local_68.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_68._M_dataplus._M_p._4_4_,local_68._M_dataplus._M_p._0_4_),
                      CONCAT44(local_68.field_2._M_allocated_capacity._4_4_,
                               local_68.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      operator_delete(local_88.d.d,local_88.d.size - (long)local_88.d.d);
    }
    anon_unknown.dwarf_22738::trim(s);
    std::istream::ignore();
    DAT_00119310 = 0;
    *(anonymous_namespace)::global_string_abi_cxx11_ = 0;
    parser();
    if ((parser()::category[0x10] & 1) != 0) {
      parser();
      local_68._M_dataplus._M_p._0_4_ = 2;
      local_68._M_dataplus._M_p._4_4_ = 0;
      local_68._M_string_length._0_4_ = 0;
      local_68._M_string_length._4_4_ = 0;
      local_68.field_2._M_allocated_capacity._0_4_ = 0;
      local_68.field_2._M_allocated_capacity._4_4_ = 0;
      local_68.field_2._8_8_ = parser()::category._8_8_;
      QMessageLogger::debug();
      pQVar1 = (QTextStream *)CONCAT71(uStack_8f,local_90);
      QVar10.m_data = (storage_type *)0x13;
      QVar10.m_size = (qsizetype)&local_88;
      QString::fromUtf8(QVar10);
      QTextStream::operator<<(pQVar1,&local_88);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
        }
      }
      if (((QTextStream *)CONCAT71(uStack_8f,local_90))[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)CONCAT71(uStack_8f,local_90),' ');
      }
      operator<<(&local_90,s);
      QDebug::~QDebug(&local_90);
    }
    (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
    __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
LAB_00105c96:
    pcVar6 = initial_state;
  }
  else {
LAB_00105b07:
    lVar2 = (anonymous_namespace)::current_class;
    bVar7 = (anonymous_namespace)::current_property != 0;
    (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
    __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
    if (bVar7) goto LAB_00105cb6;
    if (lVar2 == 0) goto LAB_00105c96;
    pcVar6 = class_state;
  }
  *(code **)&(__return_storage_ptr__->super__Function_base)._M_functor = pcVar6;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_manager;
LAB_00105cb6:
  if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

callback_t multi_purpose_string_state(MetaConfiguration &conf, std::ifstream &f,
                                      int &error) {
  std::vector<char> delimiters = {'{', '[', '=', ' ', '\n'};
  global_string += read_untill_delimiters(f, delimiters);
  trim(global_string);

  qCDebug(parser) << "string found: " << global_string
                  << " next character: " << (char)f.peek();
  if (!conf.top_level_class && global_string == "namespace") {
    conf.conf_namespace = read_untill_delimiters(f, {'{'});
    trim(conf.conf_namespace);

    f.ignore();
    global_string.clear();
    qCDebug(parser) << "Setting a namespace" << conf.conf_namespace;
    return initial_state;
  }

  return current_property ? nullptr // create a state for them.
                          : current_class ? class_state : initial_state;
}